

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int act_cbl(nt_opts *opts)

{
  uint uVar1;
  char *__s;
  char *str;
  char *str_00;
  nifti_image *pnVar2;
  int *__ptr;
  size_t sVar3;
  long lVar4;
  int iVar5;
  nifti_brick_list NBL;
  nifti_brick_list nStack_48;
  
  if (2 < g_debug) {
    act_cbl_cold_1();
  }
  if (opts->prefix == (char *)0x0) {
    act_cbl_cold_7();
  }
  else if ((opts->infiles).len < 2) {
    __s = nifti_strdup(*(opts->infiles).list);
    str = strchr(__s,0x5b);
    if ((str == (char *)0x0) && (str = strchr(__s,0x7b), str == (char *)0x0)) {
      if (1 < g_debug) {
        fprintf(_stderr,"-d using -cbl without brick list in \'%s\'\n",__s);
      }
      str_00 = nifti_strdup("[0..$]");
    }
    else {
      str_00 = nifti_strdup(str);
      *str = '\0';
    }
    if (1 < g_debug) {
      fprintf(_stderr,"+d -cbl: using \'%s\' for selection string\n",str_00);
    }
    pnVar2 = nt_image_read(opts,__s,0);
    if (pnVar2 != (nifti_image *)0x0) {
      iVar5 = 1;
      if (0 < pnVar2->nt) {
        uVar1 = pnVar2->dim[0];
        if ((int)uVar1 < 1) {
          iVar5 = 0;
        }
        else if (3 < uVar1) {
          lVar4 = 0;
          do {
            iVar5 = iVar5 * pnVar2->dim[lVar4 + 4];
            lVar4 = lVar4 + 1;
          } while ((ulong)uVar1 - 3 != lVar4);
        }
      }
      __ptr = nifti_get_intlist(iVar5,str_00);
      nifti_image_free(pnVar2);
      if (__ptr == (int *)0x0) {
        act_cbl_cold_5();
      }
      else {
        pnVar2 = nt_read_bricks(opts,__s,*__ptr,__ptr + 1,&nStack_48);
        free(__ptr);
        if (pnVar2 != (nifti_image *)0x0) {
          if (1 < g_debug) {
            act_cbl_cold_2();
          }
          if (opts->keep_hist != 0) {
            sVar3 = strlen(opts->command);
            iVar5 = nifti_add_extension(pnVar2,opts->command,(int)sVar3,6);
            if (iVar5 != 0) {
              act_cbl_cold_3();
            }
          }
          iVar5 = nifti_set_filenames(pnVar2,opts->prefix,1,1);
          if (iVar5 != 0) {
            act_cbl_cold_4();
          }
          if (2 < g_debug) {
            disp_field("new nim:\n",g_nim_fields,pnVar2,0x3f,1);
          }
          if ((iVar5 == 0) && (iVar5 = nifti_nim_is_valid(pnVar2,g_debug), iVar5 != 0)) {
            nifti_image_write_bricks(pnVar2,&nStack_48);
          }
          nifti_image_free(pnVar2);
          nifti_free_NBL(&nStack_48);
          free(__s);
          free(str_00);
          return 0;
        }
        free(__s);
        free(str_00);
      }
    }
  }
  else {
    act_cbl_cold_6();
  }
  return 1;
}

Assistant:

int act_cbl( nt_opts * opts )
{
   nifti_brick_list   NBL;
   nifti_image      * nim;
   char             * fname, * selstr, * cp;
   int              * blist;
   int                err = 0;

   if( g_debug > 2 )
      fprintf(stderr,"-d copying file info from '%s' to '%s'\n",
              opts->infiles.list[0], opts->prefix);

   /* sanity checks */
   if( ! opts->prefix ) {
      fprintf(stderr,"** error: -prefix is required with -cbl function\n");
      return 1;
   } else if( opts->infiles.len > 1 ) {
      fprintf(stderr,"** sorry, at the moment -cbl allows only 1 input\n");
      return 1;
   }

   /* remove selector from fname, and copy selector string */
   fname = nifti_strdup(opts->infiles.list[0]);
   cp = strchr(fname,'[');  if( !cp )  cp = strchr(fname,'{');

   if( !cp ) {
      if( g_debug > 1 )
         fprintf(stderr,"-d using -cbl without brick list in '%s'\n",fname);
      selstr = nifti_strdup("[0..$]");
   } else {
      selstr = nifti_strdup(cp);
      *cp = '\0';    /* remove selection string from fname */
   }

   if( g_debug > 1 )
      fprintf(stderr,"+d -cbl: using '%s' for selection string\n", selstr);

   nim = nt_image_read(opts, fname, 0);  /* get image */
   if( !nim ) return 1;

   /* since nt can be zero now (sigh), check for it   02 Mar 2006 [rickr] */
   blist = nifti_get_intlist(nim->nt > 0 ? num_volumes(nim) : 1, selstr);
   nifti_image_free(nim);             /* throw away, will re-load */
   if( !blist ){
      fprintf(stderr,"** failed sub-brick selection using '%s'\n",selstr);
      free(fname);  free(selstr);  return 1;
   }

   nim = nt_read_bricks(opts, fname, blist[0], blist+1, &NBL);
   free(blist);  /* with this */
   if( !nim ){  free(fname);  free(selstr);  return 1; }

   if( g_debug > 1 ) fprintf(stderr,"+d sub-bricks loaded\n");

   /* add command as COMMENT extension */
   if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                          strlen(opts->command), NIFTI_ECODE_COMMENT) )
      fprintf(stderr,"** failed to add command to image as extension\n");

   /* replace filenames using prefix */
   if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
   {
      fprintf(stderr,"** failed to set names, prefix = '%s'\n",opts->prefix);
      err++;
   }

   if(g_debug>2) disp_field("new nim:\n",g_nim_fields,nim,NT_NIM_NUM_FIELDS,1);

   /* and finally, write out results */
   if( err == 0 && nifti_nim_is_valid(nim, g_debug) )
      nifti_image_write_bricks(nim, &NBL);

   nifti_image_free(nim);
   nifti_free_NBL(&NBL);
   free(fname);
   free(selstr);

   return 0;
}